

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughColorMapMonoToRgbaFB *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *prefix_00;
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  long lVar5;
  XrPassthroughColorMapMonoToRgbaFB *in_stack_fffffffffffffd48;
  XrColor4f *local_2b0;
  string texturecolormap_array_prefix;
  string texturecolormap_prefix;
  string type_prefix;
  string next_prefix;
  string local_228;
  string local_208;
  undefined1 local_1e8 [64];
  ostringstream oss_textureColorMap_array;
  uint auStack_190 [2];
  PFN_xrCreateSession local_188;
  PFN_xrDestroySession p_Stack_180;
  PFN_xrEnumerateReferenceSpaces local_178;
  PFN_xrCreateReferenceSpace p_Stack_170;
  
  PointerToHexString<XrPassthroughColorMapMonoToRgbaFB>(in_stack_fffffffffffffd48);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_textureColorMap_array);
  std::__cxx11::string::~string((string *)&oss_textureColorMap_array);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_textureColorMap_array,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_textureColorMap_array);
    std::__cxx11::string::~string((string *)&oss_textureColorMap_array);
  }
  else {
    local_178 = (PFN_xrEnumerateReferenceSpaces)0x0;
    p_Stack_170 = (PFN_xrCreateReferenceSpace)0x0;
    local_188 = (PFN_xrCreateSession)0x0;
    p_Stack_180 = (PFN_xrDestroySession)0x0;
    auStack_190[0] = 0;
    auStack_190[1] = 0;
    _oss_textureColorMap_array = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_textureColorMap_array);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_textureColorMap_array);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_228,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_228,contents);
  std::__cxx11::string::~string((string *)&local_228);
  if (bVar2) {
    std::__cxx11::string::string((string *)&texturecolormap_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&texturecolormap_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_textureColorMap_array);
    *(uint *)((long)auStack_190 + *(long *)(_oss_textureColorMap_array + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_oss_textureColorMap_array + -0x18)) & 0xffffffb5 |
         8;
    local_2b0 = value->textureColorMap;
    std::ostream::_M_insert<void_const*>(&oss_textureColorMap_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [11])"XrColor4f*",&texturecolormap_prefix,
               &texturecolormap_array_prefix);
    std::__cxx11::string::~string((string *)&texturecolormap_array_prefix);
    lVar5 = 0;
    prefix_00 = (string *)(local_1e8 + 0x20);
    while( true ) {
      if (lVar5 == 0x100) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_textureColorMap_array);
        std::__cxx11::string::~string((string *)&texturecolormap_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string
                ((string *)&texturecolormap_array_prefix,(string *)&texturecolormap_prefix);
      std::__cxx11::string::append((char *)&texturecolormap_array_prefix);
      std::__cxx11::to_string(&local_208,(uint)lVar5);
      std::__cxx11::string::append((string *)&texturecolormap_array_prefix);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::append((char *)&texturecolormap_array_prefix);
      std::__cxx11::string::string((string *)prefix_00,(string *)&texturecolormap_array_prefix);
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_1e8;
      std::__cxx11::string::string((string *)local_1e8,"XrColor4f",(allocator *)&local_208);
      bVar2 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,local_2b0,prefix_00,(string *)local_1e8,false,
                         contents);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)prefix_00);
      if (!bVar2) break;
      std::__cxx11::string::~string((string *)&texturecolormap_array_prefix);
      lVar5 = lVar5 + 1;
      local_2b0 = local_2b0 + 1;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughColorMapMonoToRgbaFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string texturecolormap_prefix = prefix;
        texturecolormap_prefix += "textureColorMap";
        std::ostringstream oss_textureColorMap_array;
        oss_textureColorMap_array << std::hex << reinterpret_cast<const void*>(value->textureColorMap);
        contents.emplace_back("XrColor4f*", texturecolormap_prefix, oss_textureColorMap_array.str());
        for (uint32_t value_texturecolormap_inc = 0; value_texturecolormap_inc < XR_PASSTHROUGH_COLOR_MAP_MONO_SIZE_FB; ++value_texturecolormap_inc) {
            std::string texturecolormap_array_prefix = texturecolormap_prefix;
            texturecolormap_array_prefix += "[";
            texturecolormap_array_prefix += std::to_string(value_texturecolormap_inc);
            texturecolormap_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->textureColorMap[value_texturecolormap_inc], texturecolormap_array_prefix, "XrColor4f", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}